

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::SetDistinct
          (RowGroupCollection *this,column_t column_id,
          unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
          *distinct_stats)

{
  reference this_00;
  type this_01;
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  stats_lock;
  _Head_base<0UL,_duckdb::DistinctStatistics_*,_false> local_30;
  
  TableStatistics::GetLock((TableStatistics *)&stack0xffffffffffffffd8);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
             *)&stack0xffffffffffffffd8);
  this_00 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                      (&(this->stats).column_stats,column_id);
  this_01 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(this_00);
  local_30._M_head_impl =
       (distinct_stats->
       super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
       .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl;
  (distinct_stats->
  super_unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctStatistics_*,_std::default_delete<duckdb::DistinctStatistics>_>
  .super__Head_base<0UL,_duckdb::DistinctStatistics_*,_false>._M_head_impl =
       (DistinctStatistics *)0x0;
  ColumnStatistics::SetDistinct
            (this_01,(unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
                      *)&local_30);
  if (local_30._M_head_impl != (DistinctStatistics *)0x0) {
    ::std::default_delete<duckdb::DistinctStatistics>::operator()
              ((default_delete<duckdb::DistinctStatistics> *)&local_30,local_30._M_head_impl);
  }
  local_30._M_head_impl = (DistinctStatistics *)0x0;
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void RowGroupCollection::SetDistinct(column_t column_id, unique_ptr<DistinctStatistics> distinct_stats) {
	D_ASSERT(column_id != COLUMN_IDENTIFIER_ROW_ID);
	auto stats_lock = stats.GetLock();
	stats.GetStats(*stats_lock, column_id).SetDistinct(std::move(distinct_stats));
}